

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void internal_counters_gga_random
               (xc_dimensions *dim,int pos,int offset,double **rho,double **sigma,double **zk,
               double **vrho,double **vsigma,double **v2rho2,double **v2rhosigma,double **v2sigma2,
               double **v3rho3,double **v3rho2sigma,double **v3rhosigma2,double **v3sigma3,
               double **v4rho4,double **v4rho3sigma,double **v4rho2sigma2,double **v4rhosigma3,
               double **v4sigma4)

{
  double **in_stack_ffffffffffffffc0;
  double **in_stack_ffffffffffffffc8;
  
  internal_counters_lda_random
            (dim,pos,offset,rho,zk,vrho,v2rho2,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
  if (*sigma != (double *)0x0) {
    *sigma = *sigma + (dim->sigma * pos + offset);
  }
  if (*vrho != (double *)0x0) {
    *vsigma = *vsigma + (dim->vsigma * pos + offset);
  }
  if (*v2rho2 != (double *)0x0) {
    *v2rhosigma = *v2rhosigma + (dim->v2rhosigma * pos + offset);
    *v2sigma2 = *v2sigma2 + (pos * dim->v2sigma2 + offset);
  }
  return;
}

Assistant:

GPU_FUNCTION void
internal_counters_gga_random
  (
   const xc_dimensions *dim, int pos, int offset, const double **rho, const double **sigma,
   double **zk GGA_OUT_PARAMS_NO_EXC(XC_COMMA double **, ))
{
  internal_counters_lda_random(dim, pos, offset, rho, zk LDA_OUT_PARAMS_NO_EXC(XC_COMMA, ));

  if(*sigma != NULL) *sigma += pos*dim->sigma  + offset;
#ifndef XC_DONT_COMPILE_VXC
  if(*vrho != NULL) *vsigma += pos*dim->vsigma + offset;
#ifndef XC_DONT_COMPILE_FXC
  if(*v2rho2 != NULL) {
    *v2rhosigma += pos*dim->v2rhosigma + offset;
    *v2sigma2   += pos*dim->v2sigma2  + offset;
  }
#ifndef XC_DONT_COMPILE_KXC
  if(*v3rho3 != NULL) {
    *v3rho2sigma += pos*dim->v3rho2sigma + offset;
    *v3rhosigma2 += pos*dim->v3rhosigma2 + offset;
    *v3sigma3    += pos*dim->v3sigma3    + offset;
  }
#ifndef XC_DONT_COMPILE_LXC
  if(*v4rho4 != NULL) {
    *v4rho3sigma  += pos*dim->v4rho3sigma  + offset;
    *v4rho2sigma2 += pos*dim->v4rho2sigma2 + offset;
    *v4rhosigma3  += pos*dim->v4rhosigma3  + offset;
    *v4sigma4     += pos*dim->v4sigma4     + offset;
  }
#endif
#endif
#endif
#endif
}